

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckUses
          (ScalarReplacementPass *this,Instruction *inst,VariableStats *stats)

{
  VariableStats *def;
  DefUseManager *this_00;
  anon_class_32_4_d4ff97f3 local_70;
  function<void_(spvtools::opt::Instruction_*,_unsigned_int)> local_50;
  bool local_29;
  uint64_t uStack_28;
  bool ok;
  uint64_t max_legal_index;
  VariableStats *stats_local;
  Instruction *inst_local;
  ScalarReplacementPass *this_local;
  
  max_legal_index = (uint64_t)stats;
  stats_local = (VariableStats *)inst;
  inst_local = (Instruction *)this;
  uStack_28 = GetMaxLegalIndex(this,inst);
  local_29 = true;
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  def = stats_local;
  local_70.max_legal_index = uStack_28;
  local_70.stats = (VariableStats *)max_legal_index;
  local_70.ok = &local_29;
  local_70.this = this;
  std::function<void(spvtools::opt::Instruction*,unsigned_int)>::
  function<spvtools::opt::ScalarReplacementPass::CheckUses(spvtools::opt::Instruction_const*,spvtools::opt::ScalarReplacementPass::VariableStats*)const::__0,void>
            ((function<void(spvtools::opt::Instruction*,unsigned_int)> *)&local_50,&local_70);
  analysis::DefUseManager::ForEachUse(this_00,(Instruction *)def,&local_50);
  std::function<void_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_50);
  return (bool)(local_29 & 1);
}

Assistant:

bool ScalarReplacementPass::CheckUses(const Instruction* inst,
                                      VariableStats* stats) const {
  uint64_t max_legal_index = GetMaxLegalIndex(inst);

  bool ok = true;
  get_def_use_mgr()->ForEachUse(inst, [this, max_legal_index, stats, &ok](
                                          const Instruction* user,
                                          uint32_t index) {
    if (user->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare ||
        user->GetCommonDebugOpcode() == CommonDebugInfoDebugValue) {
      // TODO: include num_partial_accesses if it uses Fragment operation or
      // DebugValue has Indexes operand.
      stats->num_full_accesses++;
      return;
    }

    // Annotations are check as a group separately.
    if (!IsAnnotationInst(user->opcode())) {
      switch (user->opcode()) {
        case spv::Op::OpAccessChain:
        case spv::Op::OpInBoundsAccessChain:
          if (index == 2u && user->NumInOperands() > 1) {
            uint32_t id = user->GetSingleWordInOperand(1u);
            const Instruction* opInst = get_def_use_mgr()->GetDef(id);
            const auto* constant =
                context()->get_constant_mgr()->GetConstantFromInst(opInst);
            if (!constant) {
              ok = false;
            } else if (constant->GetZeroExtendedValue() >= max_legal_index) {
              ok = false;
            } else {
              if (!CheckUsesRelaxed(user)) ok = false;
            }
            stats->num_partial_accesses++;
          } else {
            ok = false;
          }
          break;
        case spv::Op::OpLoad:
          if (!CheckLoad(user, index)) ok = false;
          stats->num_full_accesses++;
          break;
        case spv::Op::OpStore:
          if (!CheckStore(user, index)) ok = false;
          stats->num_full_accesses++;
          break;
        case spv::Op::OpName:
        case spv::Op::OpMemberName:
          break;
        default:
          ok = false;
          break;
      }
    }
  });

  return ok;
}